

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O1

void __thiscall capnp::FlatMessageBuilder::requireFilled(FlatMessageBuilder *this)

{
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar1;
  Fault f;
  DebugComparison<const_capnp::word_*,_capnp::word_*> _kjCondition;
  
  AVar1 = _::BuilderArena::getSegmentsForOutput
                    ((BuilderArena *)(this->super_MessageBuilder).arenaSpace);
  _kjCondition.left = (AVar1.ptr)->ptr + (AVar1.ptr)->size_;
  _kjCondition.right = (this->array).ptr + (this->array).size_;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == _kjCondition.right;
  if (_kjCondition.result) {
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::word_const*,capnp::word*>&,char_const(&)[43]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message.c++"
             ,299,FAILED,"getSegmentsForOutput()[0].end() == array.end()",
             "_kjCondition,\"FlatMessageBuilder\'s buffer was too large.\"",&_kjCondition,
             (char (*) [43])"FlatMessageBuilder\'s buffer was too large.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void FlatMessageBuilder::requireFilled() {
  KJ_REQUIRE(getSegmentsForOutput()[0].end() == array.end(),
          "FlatMessageBuilder's buffer was too large.");
}